

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

ArrayWithPreallocation<unsigned_char,_8UL> * __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::operator=
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,
          ArrayWithPreallocation<unsigned_char,_8UL> *other)

{
  bool bVar1;
  ulong local_20;
  size_t i;
  ArrayWithPreallocation<unsigned_char,_8UL> *other_local;
  ArrayWithPreallocation<unsigned_char,_8UL> *this_local;
  
  clear(this);
  bVar1 = isHeapAllocated(other);
  if (bVar1) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = other->numAllocated;
    resetToInternalStorage(other);
    other->numActive = 0;
  }
  else {
    this->numActive = other->numActive;
    for (local_20 = 0; local_20 < this->numActive; local_20 = local_20 + 1) {
      this->items[local_20] = other->items[local_20];
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (ArrayWithPreallocation&& other) noexcept
    {
        clear();

        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }

        return *this;
    }